

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testGroupStarting
          (StreamingReporterBase<Catch::CompactReporter> *this,GroupInfo *_groupInfo)

{
  char *pcVar1;
  pointer pcVar2;
  size_t sVar3;
  
  Option<Catch::GroupInfo>::reset(&(this->currentGroupInfo).super_Option<Catch::GroupInfo>);
  pcVar1 = (this->currentGroupInfo).super_Option<Catch::GroupInfo>.storage;
  *(char **)(this->currentGroupInfo).super_Option<Catch::GroupInfo>.storage =
       (this->currentGroupInfo).super_Option<Catch::GroupInfo>.storage + 0x10;
  pcVar2 = (_groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pcVar1,pcVar2,pcVar2 + (_groupInfo->name)._M_string_length);
  sVar3 = _groupInfo->groupsCounts;
  *(size_t *)((this->currentGroupInfo).super_Option<Catch::GroupInfo>.storage + 0x20) =
       _groupInfo->groupIndex;
  *(size_t *)((this->currentGroupInfo).super_Option<Catch::GroupInfo>.storage + 0x28) = sVar3;
  (this->currentGroupInfo).super_Option<Catch::GroupInfo>.nullableValue = (GroupInfo *)pcVar1;
  (this->currentGroupInfo).used = false;
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }